

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O2

bool duckdb::ShouldRenderWhitespace(RenderTree *root,idx_t x,idx_t y)

{
  bool bVar1;
  optional_ptr<duckdb::RenderTreeNode,_true> oVar2;
  RenderTreeNode *pRVar3;
  ulong uVar4;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  optional_ptr<duckdb::RenderTreeNode,_true> local_40;
  idx_t local_38;
  
  local_38 = y + 1;
  uVar4 = 0;
  while( true ) {
    oVar2 = RenderTree::GetNode(root,x,y);
    local_40 = oVar2;
    bVar1 = RenderTree::HasNode(root,x,local_38);
    uVar4 = bVar1 + uVar4;
    if (oVar2.ptr != (RenderTreeNode *)0x0) break;
    bVar1 = x == 0;
    x = x - 1;
    if (bVar1) {
      return false;
    }
  }
  pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator*(&local_40);
  if ((ulong)((long)(pRVar3->child_positions).
                    super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                    .
                    super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pRVar3->child_positions).
                   super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                   .
                   super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
    return false;
  }
  pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&local_40);
  if ((ulong)((long)(pRVar3->child_positions).
                    super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                    .
                    super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar3->child_positions).
                    super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                    .
                    super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) {
    return false;
  }
  return true;
}

Assistant:

static bool ShouldRenderWhitespace(RenderTree &root, idx_t x, idx_t y) {
	idx_t found_children = 0;
	for (;; x--) {
		auto node = root.GetNode(x, y);
		if (root.HasNode(x, y + 1)) {
			found_children++;
		}
		if (node) {
			if (NodeHasMultipleChildren(*node)) {
				if (found_children < node->child_positions.size()) {
					return true;
				}
			}
			return false;
		}
		if (x == 0) {
			break;
		}
	}
	return false;
}